

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O3

Expression *
slang::ast::ConversionExpression::fromSyntax
          (Compilation *comp,CastExpressionSyntax *syntax,ASTContext *context,Type *assignmentTarget
          )

{
  SymbolKind SVar1;
  SourceRange opRange;
  TempVarSymbol *this;
  bool bVar2;
  bitmask<slang::ast::IntegralFlags> flags;
  int iVar3;
  undefined4 extraout_var;
  Expression *pEVar4;
  Type *pTVar5;
  StreamingConcatenationExpression *this_00;
  Symbol *pSVar6;
  optional<int> value;
  SourceLocation SVar7;
  Diagnostic *diag;
  SourceLocation SVar8;
  Diagnostic *pDVar9;
  ConversionExpression *pCVar10;
  undefined1 auVar11 [8];
  Compilation *compilation;
  SourceRange SVar12;
  SourceRange sourceRange;
  Expression *operand;
  anon_class_32_4_0791e916 result;
  undefined1 in_stack_ffffffffffffff6c [12];
  undefined1 local_88 [8];
  SourceLocation local_80;
  ConversionKind local_74;
  Compilation *local_70;
  TempVarSymbol *local_68;
  Compilation *local_60;
  AssertionInstanceDetails *local_58;
  Expression **local_50;
  CastExpressionSyntax *local_48;
  SourceRange local_40;
  
  iVar3 = Expression::bind((int)(syntax->left).ptr,(sockaddr *)context,4);
  pEVar4 = (Expression *)CONCAT44(extraout_var,iVar3);
  bVar2 = Expression::bad(pEVar4);
  if (bVar2) goto LAB_0041d904;
  if (pEVar4->kind == DataType) {
    SVar7 = (SourceLocation)(pEVar4->type).ptr;
    local_80 = SVar7;
    bVar2 = Type::isSimpleType((Type *)SVar7);
    if (!bVar2) {
      pTVar5 = *(Type **)((long)SVar7 + 0x40);
      if (pTVar5 == (Type *)0x0) {
        Type::resolveCanonical((Type *)SVar7);
        pTVar5 = *(Type **)((long)SVar7 + 0x40);
      }
      SVar1 = (pTVar5->super_Symbol).kind;
      if (((SVar1 != StringType) && (SVar1 != ErrorType)) &&
         ((((syntax->left).ptr)->super_SyntaxNode).kind != TypeReference)) {
        pDVar9 = ASTContext::addDiag(context,(DiagCode)0x200007,pEVar4->sourceRange);
        ast::operator<<(pDVar9,(Type *)SVar7);
        goto LAB_0041d904;
      }
    }
    SVar8 = SVar7;
    local_68 = (TempVarSymbol *)assignmentTarget;
    this_00 = (StreamingConcatenationExpression *)
              Expression::create(comp,(ExpressionSyntax *)(syntax->right).ptr,context,
                                 (bitmask<slang::ast::ASTFlags>)0x80,(Type *)SVar7);
    local_88 = (undefined1  [8])this_00;
    bVar2 = Expression::bad((Expression *)this_00);
    if (bVar2) goto LAB_0041d904;
  }
  else {
    value = ASTContext::evalInteger(context,pEVar4,(bitmask<slang::ast::EvalFlags>)0x0);
    if ((((ulong)value.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int> >> 0x20 & 1) == 0) ||
       (bVar2 = ASTContext::requireGtZero(context,value,pEVar4->sourceRange), !bVar2)) {
LAB_0041d904:
      pEVar4 = Expression::badExpr(comp,(Expression *)0x0);
      return pEVar4;
    }
    bVar2 = ASTContext::requireValidBitWidth
                      (context,value.super__Optional_base<int,_true,_true>._M_payload.
                               super__Optional_payload_base<int>._M_payload,pEVar4->sourceRange);
    if (!bVar2) goto LAB_0041d904;
    SVar8 = (SourceLocation)0x0;
    local_68 = (TempVarSymbol *)assignmentTarget;
    this_00 = (StreamingConcatenationExpression *)
              Expression::create(comp,(ExpressionSyntax *)(syntax->right).ptr,context,
                                 (bitmask<slang::ast::ASTFlags>)0x80,(Type *)0x0);
    local_88 = (undefined1  [8])this_00;
    bVar2 = Expression::bad((Expression *)this_00);
    if (bVar2) goto LAB_0041d904;
    bVar2 = Type::isIntegral((this_00->super_Expression).type.ptr);
    if (!bVar2) {
      SVar8 = parsing::Token::location(&syntax->apostrophe);
      pDVar9 = ASTContext::addDiag(context,(DiagCode)0x250007,SVar8);
      ast::operator<<(pDVar9,(this_00->super_Expression).type.ptr);
      pDVar9 = Diagnostic::operator<<(pDVar9,pEVar4->sourceRange);
      Diagnostic::operator<<(pDVar9,(this_00->super_Expression).sourceRange);
      goto LAB_0041d904;
    }
    flags = Type::getIntegralFlags((this_00->super_Expression).type.ptr);
    SVar7 = (SourceLocation)
            Compilation::getType
                      (comp,value.super__Optional_base<int,_true,_true>._M_payload.
                            super__Optional_payload_base<int>._M_payload,flags);
    local_80 = SVar7;
  }
  local_58 = (AssertionInstanceDetails *)&stack0xffffffffffffff80;
  local_50 = (Expression **)local_88;
  local_70 = comp;
  local_60 = comp;
  local_48 = syntax;
  bVar2 = Type::isCastCompatible((Type *)SVar7,(this_00->super_Expression).type.ptr);
  if (bVar2) {
    bVar2 = Type::isMatching((Type *)local_80,
                             ((not_null<const_slang::ast::Type_*> *)((long)local_88 + 8))->ptr);
    this = local_68;
    compilation = local_70;
    if ((bVar2) &&
       ((pSVar6 = Expression::getSymbolReference((Expression *)local_88,true),
        pSVar6 == (Symbol *)0x0 ||
        ((pSVar6->kind != Genvar && ((pSVar6->kind != Parameter || (pSVar6[5].field_0x34 == '\0'))))
        )))) {
      SVar8 = (SourceLocation)((not_null<const_slang::ast::Type_*> *)((long)local_88 + 8))->ptr;
      if (*(int *)local_80 == 0x23) {
        if (SVar8 == local_80) {
LAB_0041dc58:
          if ((((this != (TempVarSymbol *)0x0) &&
               (bVar2 = Type::isMatching((Type *)this,(Type *)local_80), bVar2)) &&
              (((Expression *)local_88)->kind != ConditionalOp)) ||
             (bVar2 = actuallyNeededCast((Type *)local_80,(Expression *)local_88), !bVar2)) {
            SVar8 = parsing::Token::location(&syntax->apostrophe);
            pDVar9 = ASTContext::addDiag(context,(DiagCode)0xd90007,SVar8);
            pDVar9 = ast::operator<<(pDVar9,((not_null<const_slang::ast::Type_*> *)
                                            ((long)local_88 + 8))->ptr);
            pDVar9 = Diagnostic::operator<<(pDVar9,pEVar4->sourceRange);
            Diagnostic::operator<<(pDVar9,*(SourceRange *)((long)local_88 + 0x20));
          }
        }
      }
      else if (*(int *)SVar8 != 0x23 || SVar8 == local_80) goto LAB_0041dc58;
    }
    bVar2 = Type::isAssignmentCompatible
                      ((Type *)local_80,
                       ((not_null<const_slang::ast::Type_*> *)((long)local_88 + 8))->ptr);
    SVar8 = local_80;
    if (bVar2) {
      bVar2 = Type::isNumeric((Type *)local_80);
      if ((bVar2) &&
         (bVar2 = Type::isNumeric(((not_null<const_slang::ast::Type_*> *)((long)local_88 + 8))->ptr)
         , bVar2)) {
        SVar8 = (SourceLocation)
                OpInfo::binaryType(compilation,(Type *)local_80,
                                   ((not_null<const_slang::ast::Type_*> *)((long)local_88 + 8))->ptr
                                   ,false,true);
      }
      SVar12 = parsing::Token::range(&syntax->apostrophe);
      opRange._4_12_ = in_stack_ffffffffffffff6c;
      opRange.startLoc._0_4_ = 3;
      Expression::contextDetermined
                ((Expression *)context,(ASTContext *)local_88,(Expression **)0x0,(Expression *)SVar8
                 ,(Type *)SVar12.startLoc,opRange,SVar12.endLoc._0_4_);
      if ((((Expression *)local_88)->kind == Conversion) &&
         (1 < *(int *)&((span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                         *)((long)local_88 + 0x30))->_M_ptr)) {
        SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        *(SourceRange *)((long)local_88 + 0x20) = SVar12;
        ((not_null<const_slang::ast::Type_*> *)((long)local_88 + 8))->ptr = (Type *)local_80;
        return &((StreamingConcatenationExpression *)local_88)->super_Expression;
      }
    }
    else {
      Expression::selfDetermined(context,(Expression **)local_88);
    }
    SVar8 = local_80;
    auVar11 = local_88;
    local_74 = Explicit;
    local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
LAB_0041ddd8:
    pCVar10 = BumpAllocator::
              emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind&,slang::ast::Expression&,slang::SourceRange>
                        (&compilation->super_BumpAllocator,(Type *)SVar8,&stack0xffffffffffffff8c,
                         (Expression *)auVar11,&stack0xffffffffffffffc0);
  }
  else {
    SVar12.endLoc = SVar8;
    SVar12.startLoc = (pEVar4->sourceRange).endLoc;
    bVar2 = Bitstream::checkClassAccess
                      ((Bitstream *)local_80,(Type *)context,
                       (ASTContext *)(pEVar4->sourceRange).startLoc,SVar12);
    compilation = local_70;
    SVar7 = local_80;
    auVar11 = local_88;
    if (bVar2) {
      if (((Expression *)local_88)->kind == Streaming) {
        bVar2 = Bitstream::isBitstreamCast
                          ((Type *)local_80,(StreamingConcatenationExpression *)local_88);
        if (bVar2) {
LAB_0041dc0e:
          SVar8 = local_80;
          auVar11 = local_88;
          local_74 = BitstreamCast;
          local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          goto LAB_0041ddd8;
        }
        SVar8 = parsing::Token::location(&syntax->apostrophe);
        diag = ASTContext::addDiag(context,(DiagCode)0x290007,SVar8);
        pDVar9 = diag;
LAB_0041de64:
        ast::operator<<(diag,(Type *)local_80);
        pDVar9 = Diagnostic::operator<<(pDVar9,pEVar4->sourceRange);
        Diagnostic::operator<<(pDVar9,*(SourceRange *)((long)local_88 + 0x20));
      }
      else {
        bVar2 = Type::isBitstreamCastable
                          ((Type *)local_80,
                           ((not_null<const_slang::ast::Type_*> *)((long)local_88 + 8))->ptr);
        if (!bVar2) {
          SVar8 = parsing::Token::location(&syntax->apostrophe);
          pDVar9 = ASTContext::addDiag(context,(DiagCode)0x230007,SVar8);
          diag = ast::operator<<(pDVar9,((not_null<const_slang::ast::Type_*> *)((long)local_88 + 8))
                                        ->ptr);
          goto LAB_0041de64;
        }
        sourceRange.endLoc = SVar8;
        sourceRange.startLoc = *(SourceLocation *)((long)local_88 + 0x28);
        bVar2 = Bitstream::checkClassAccess
                          ((Bitstream *)
                           ((not_null<const_slang::ast::Type_*> *)((long)local_88 + 8))->ptr,
                           (Type *)context,
                           (ASTContext *)((SourceRange *)((long)local_88 + 0x20))->startLoc,
                           sourceRange);
        if (bVar2) goto LAB_0041dc0e;
      }
      pCVar10 = fromSyntax::anon_class_32_4_0791e916::operator()
                          ((anon_class_32_4_0791e916 *)&stack0xffffffffffffffa0,Explicit);
    }
    else {
      local_74 = Explicit;
      local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      compilation = local_70;
      pCVar10 = BumpAllocator::
                emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind&,slang::ast::Expression&,slang::SourceRange>
                          (&local_70->super_BumpAllocator,(Type *)SVar7,&stack0xffffffffffffff8c,
                           (Expression *)auVar11,&stack0xffffffffffffffc0);
    }
    pCVar10 = (ConversionExpression *)Expression::badExpr(compilation,&pCVar10->super_Expression);
  }
  return &pCVar10->super_Expression;
}

Assistant:

Expression& ConversionExpression::fromSyntax(Compilation& comp, const CastExpressionSyntax& syntax,
                                             const ASTContext& context,
                                             const Type* assignmentTarget) {
    auto& targetExpr = bind(*syntax.left, context, ASTFlags::AllowDataType);
    if (targetExpr.bad())
        return badExpr(comp, nullptr);

    auto type = &comp.getErrorType();
    Expression* operand;
    if (targetExpr.kind == ExpressionKind::DataType) {
        type = targetExpr.type;
        if (!type->isSimpleType() && !type->isError() && !type->isString() &&
            syntax.left->kind != SyntaxKind::TypeReference) {
            context.addDiag(diag::BadCastType, targetExpr.sourceRange) << *type;
            return badExpr(comp, nullptr);
        }

        operand = &create(comp, *syntax.right, context, ASTFlags::StreamingAllowed, type);
        if (operand->bad())
            return badExpr(comp, nullptr);
    }
    else {
        auto val = context.evalInteger(targetExpr);
        if (!val || !context.requireGtZero(val, targetExpr.sourceRange))
            return badExpr(comp, nullptr);

        bitwidth_t width = bitwidth_t(*val);
        if (!context.requireValidBitWidth(width, targetExpr.sourceRange))
            return badExpr(comp, nullptr);

        operand = &create(comp, *syntax.right, context, ASTFlags::StreamingAllowed);
        if (operand->bad())
            return badExpr(comp, nullptr);

        if (!operand->type->isIntegral()) {
            auto& diag = context.addDiag(diag::BadIntegerCast, syntax.apostrophe.location());
            diag << *operand->type;
            diag << targetExpr.sourceRange << operand->sourceRange;
            return badExpr(comp, nullptr);
        }

        type = &comp.getType(width, operand->type->getIntegralFlags());
    }

    auto result = [&](ConversionKind cast = ConversionKind::Explicit) {
        return comp.emplace<ConversionExpression>(*type, cast, *operand, syntax.sourceRange());
    };

    if (!type->isCastCompatible(*operand->type)) {
        if (!Bitstream::checkClassAccess(*type, context, targetExpr.sourceRange)) {
            return badExpr(comp, result());
        }

        if (operand->kind == ExpressionKind::Streaming) {
            if (!Bitstream::isBitstreamCast(*type,
                                            operand->as<StreamingConcatenationExpression>())) {
                auto& diag = context.addDiag(diag::BadStreamCast, syntax.apostrophe.location());
                diag << *type;
                diag << targetExpr.sourceRange << operand->sourceRange;
                return badExpr(comp, result());
            }
        }
        else if (!type->isBitstreamCastable(*operand->type)) {
            auto& diag = context.addDiag(diag::BadConversion, syntax.apostrophe.location());
            diag << *operand->type << *type;
            diag << targetExpr.sourceRange << operand->sourceRange;
            return badExpr(comp, result());
        }
        else if (!Bitstream::checkClassAccess(*operand->type, context, operand->sourceRange)) {
            return badExpr(comp, result());
        }

        return *result(ConversionKind::BitstreamCast);
    }

    // We have a useless cast if the type of the operand matches what we're casting to, unless:
    // - We needed the assignment-like context of the cast (like for an unpacked array concat)
    // - We weren't already in an assignment-like context of the correct type
    // - We're casting a genvar (people dislike seeing warnings about genvar operands)
    // - We're casting to a different typedef even if it's a matching underlying type
    auto isGenvar = [&] {
        if (auto sym = operand->getSymbolReference()) {
            return sym->kind == SymbolKind::Genvar || (sym->kind == SymbolKind::Parameter &&
                                                       sym->as<ParameterSymbol>().isFromGenvar());
        }
        return false;
    };

    auto isDifferentTypedef = [&] {
        return (type->isAlias() || operand->type->isAlias()) && type != operand->type;
    };

    if (type->isMatching(*operand->type) && !isGenvar() && !isDifferentTypedef() &&
        ((assignmentTarget && assignmentTarget->isMatching(*type) &&
          operand->kind != ExpressionKind::ConditionalOp) ||
         !actuallyNeededCast(*type, *operand))) {
        context.addDiag(diag::UselessCast, syntax.apostrophe.location())
            << *operand->type << targetExpr.sourceRange << operand->sourceRange;
    }

    if (type->isAssignmentCompatible(*operand->type)) {
        // The type we propagate should use the sign of the operand, just like it
        // would if we were doing an implicit conversion via an assignment expression.
        auto propagatedType = type;
        if (type->isNumeric() && operand->type->isNumeric()) {
            propagatedType = OpInfo::binaryType(comp, type, operand->type, false,
                                                /* signednessFromRt */ true);
        }

        contextDetermined(context, operand, nullptr, *propagatedType, syntax.apostrophe.range(),
                          ConversionKind::Explicit);

        if (operand->kind == ExpressionKind::Conversion &&
            !operand->as<ConversionExpression>().isImplicit()) {
            operand->sourceRange = syntax.sourceRange();
            operand->type = type;
            return *operand;
        }
    }
    else {
        selfDetermined(context, operand);
    }

    return *result();
}